

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<8,_8192>::CollectUnmarked(ObjectBlockPool<8,_8192> *this)

{
  SmallBlock<8> **ppSVar1;
  SmallBlock<8> *pSVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  SmallBlock<8> *pSVar6;
  uint newSize;
  FastVector<SmallBlock<8>_*,_false,_false> *this_00;
  SmallBlock<8> *pSVar7;
  ulong uVar8;
  SmallBlock<8> *local_40;
  FastVector<SmallBlock<8>_*,_false,_false> *local_38;
  
  pSVar2 = (SmallBlock<8> *)this->activePages;
  if (pSVar2 != (SmallBlock<8> *)0x0) {
    local_38 = &this->objectsToFree;
    uVar4 = (ulong)this->lastNum;
    pSVar7 = pSVar2;
    do {
      if ((pSVar7 != pSVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
        uVar8 = 0;
        pSVar6 = pSVar7;
        do {
          pSVar6 = pSVar6 + 1;
          if ((pSVar6->marker & 3) == 0) {
            if (((uint)pSVar6->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = &this->objectsToFinalize;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_00221f7d:
                ppSVar1[newSize] = pSVar6;
                goto LAB_00221f81;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_00221f7d;
              }
            }
            local_40 = pSVar6;
            FastVector<SmallBlock<8>_*,_false,_false>::grow_and_add(this_00,newSize,&local_40);
          }
LAB_00221f81:
          uVar8 = uVar8 + 1;
          pSVar2 = (SmallBlock<8> *)this->activePages;
          uVar4 = (ulong)this->lastNum;
          uVar5 = 0x2000;
          if (pSVar7 == pSVar2) {
            uVar5 = uVar4;
          }
        } while (uVar8 < uVar5);
      }
      pSVar7 = (SmallBlock<8> *)pSVar7[0x2001].marker;
    } while (pSVar7 != (SmallBlock<8> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}